

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<const_void_*,_QCss::StyleSheet>::emplaceValue<QCss::StyleSheet>
          (Node<const_void_*,_QCss::StyleSheet> *this,StyleSheet *args)

{
  Data *pDVar1;
  StyleRule *pSVar2;
  qsizetype qVar3;
  Data *pDVar4;
  MediaRule *pMVar5;
  Data *pDVar6;
  PageRule *pPVar7;
  Data *pDVar8;
  AnimationRule *pAVar9;
  Data *pDVar10;
  ImportRule *pIVar11;
  Data *pDVar12;
  QTypedArrayData<QCss::StyleRule> *__old_val;
  StyleRule *__old_val_1;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleRule> local_f8;
  QArrayDataPointer<QCss::MediaRule> local_e0;
  QArrayDataPointer<QCss::PageRule> local_c8;
  QArrayDataPointer<QCss::AnimationRule> local_b0;
  QArrayDataPointer<QCss::ImportRule> local_98;
  undefined8 uStack_80;
  QMultiHash<QString,_QCss::StyleRule> local_78;
  QMultiHash<QString,_QCss::StyleRule> local_68;
  QArrayDataPointer<QCss::StyleRule> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (args->styleRules).d.d;
  (args->styleRules).d.d = (Data *)0x0;
  pSVar2 = (args->styleRules).d.ptr;
  (args->styleRules).d.ptr = (StyleRule *)0x0;
  qVar3 = (args->styleRules).d.size;
  (args->styleRules).d.size = 0;
  local_e0.d = (args->mediaRules).d.d;
  local_e0.ptr = (args->mediaRules).d.ptr;
  (args->mediaRules).d.d = (Data *)0x0;
  (args->mediaRules).d.ptr = (MediaRule *)0x0;
  local_e0.size = (args->mediaRules).d.size;
  (args->mediaRules).d.size = 0;
  local_c8.d = (args->pageRules).d.d;
  local_c8.ptr = (args->pageRules).d.ptr;
  (args->pageRules).d.d = (Data *)0x0;
  (args->pageRules).d.ptr = (PageRule *)0x0;
  local_c8.size = (args->pageRules).d.size;
  (args->pageRules).d.size = 0;
  local_b0.d = (args->animationRules).d.d;
  local_b0.ptr = (args->animationRules).d.ptr;
  (args->animationRules).d.d = (Data *)0x0;
  (args->animationRules).d.ptr = (AnimationRule *)0x0;
  local_b0.size = (args->animationRules).d.size;
  (args->animationRules).d.size = 0;
  local_98.d = (args->importRules).d.d;
  local_98.ptr = (args->importRules).d.ptr;
  (args->importRules).d.d = (Data *)0x0;
  (args->importRules).d.ptr = (ImportRule *)0x0;
  local_98.size = (args->importRules).d.size;
  uStack_80._0_4_ = args->origin;
  uStack_80._4_4_ = args->depth;
  (args->importRules).d.size = 0;
  local_78.d = (args->nameIndex).d;
  (args->nameIndex).d = (Data *)0x0;
  local_78.m_size = (args->nameIndex).m_size;
  (args->nameIndex).m_size = 0;
  local_68.d = (args->idIndex).d;
  (args->idIndex).d = (Data *)0x0;
  local_68.m_size = (args->idIndex).m_size;
  (args->idIndex).m_size = 0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (StyleRule *)0x0;
  local_f8.size = 0;
  local_58.d = (this->value).styleRules.d.d;
  local_58.ptr = (this->value).styleRules.d.ptr;
  (this->value).styleRules.d.d = pDVar1;
  (this->value).styleRules.d.ptr = pSVar2;
  local_58.size = (this->value).styleRules.d.size;
  (this->value).styleRules.d.size = qVar3;
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_58);
  qVar3 = local_e0.size;
  pMVar5 = local_e0.ptr;
  pDVar4 = local_e0.d;
  local_e0.d = (Data *)0x0;
  local_e0.ptr = (MediaRule *)0x0;
  local_e0.size = 0;
  local_58.d = (Data *)(this->value).mediaRules.d.d;
  local_58.ptr = (StyleRule *)(this->value).mediaRules.d.ptr;
  (this->value).mediaRules.d.d = pDVar4;
  (this->value).mediaRules.d.ptr = pMVar5;
  local_58.size = (this->value).mediaRules.d.size;
  (this->value).mediaRules.d.size = qVar3;
  QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::MediaRule> *)&local_58);
  qVar3 = local_c8.size;
  pPVar7 = local_c8.ptr;
  pDVar6 = local_c8.d;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (PageRule *)0x0;
  local_c8.size = 0;
  local_58.d = (Data *)(this->value).pageRules.d.d;
  local_58.ptr = (StyleRule *)(this->value).pageRules.d.ptr;
  (this->value).pageRules.d.d = pDVar6;
  (this->value).pageRules.d.ptr = pPVar7;
  local_58.size = (this->value).pageRules.d.size;
  (this->value).pageRules.d.size = qVar3;
  QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::PageRule> *)&local_58);
  qVar3 = local_b0.size;
  pAVar9 = local_b0.ptr;
  pDVar8 = local_b0.d;
  local_b0.d = (Data *)0x0;
  local_b0.ptr = (AnimationRule *)0x0;
  local_b0.size = 0;
  local_58.d = (Data *)(this->value).animationRules.d.d;
  local_58.ptr = (StyleRule *)(this->value).animationRules.d.ptr;
  (this->value).animationRules.d.d = pDVar8;
  (this->value).animationRules.d.ptr = pAVar9;
  local_58.size = (this->value).animationRules.d.size;
  (this->value).animationRules.d.size = qVar3;
  QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::AnimationRule> *)&local_58);
  qVar3 = local_98.size;
  pIVar11 = local_98.ptr;
  pDVar10 = local_98.d;
  local_98.d = (Data *)0x0;
  local_98.ptr = (ImportRule *)0x0;
  local_98.size = 0;
  local_58.d = (Data *)(this->value).importRules.d.d;
  local_58.ptr = (StyleRule *)(this->value).importRules.d.ptr;
  (this->value).importRules.d.d = pDVar10;
  (this->value).importRules.d.ptr = pIVar11;
  local_58.size = (this->value).importRules.d.size;
  (this->value).importRules.d.size = qVar3;
  QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::ImportRule> *)&local_58);
  qVar3 = local_78.m_size;
  pDVar12 = local_78.d;
  (this->value).origin = (undefined4)uStack_80;
  (this->value).depth = uStack_80._4_4_;
  local_78.d = (Data *)0x0;
  local_78.m_size = 0;
  local_58.d = (Data *)(this->value).nameIndex.d;
  (this->value).nameIndex.d = pDVar12;
  local_58.ptr = (StyleRule *)(this->value).nameIndex.m_size;
  (this->value).nameIndex.m_size = qVar3;
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
            ((QMultiHash<QString,_QCss::StyleRule> *)&local_58);
  qVar3 = local_68.m_size;
  pDVar12 = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.m_size = 0;
  local_58.d = (Data *)(this->value).idIndex.d;
  (this->value).idIndex.d = pDVar12;
  local_58.ptr = (StyleRule *)(this->value).idIndex.m_size;
  (this->value).idIndex.m_size = qVar3;
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
            ((QMultiHash<QString,_QCss::StyleRule> *)&local_58);
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_68);
  QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_78);
  QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }